

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O3

void __thiscall
despot::MemoryPool<despot::TigerState>::DeleteAll(MemoryPool<despot::TigerState> *this)

{
  Chunk *pCVar1;
  pointer ppCVar2;
  pointer ppTVar3;
  long lVar4;
  pointer ppCVar5;
  
  ppCVar5 = (this->chunks_).
            super__Vector_base<despot::MemoryPool<despot::TigerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TigerState>::Chunk_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar5 !=
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::TigerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TigerState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pCVar1 = *ppCVar5;
      if (pCVar1 != (Chunk *)0x0) {
        lVar4 = 0x27d8;
        do {
          despot::State::~State(&pCVar1->Objects[0].super_State + lVar4);
          lVar4 = lVar4 + -0x28;
        } while (lVar4 != -0x28);
      }
      operator_delete(pCVar1,0x2800);
      ppCVar5 = ppCVar5 + 1;
    } while (ppCVar5 !=
             (this->chunks_).
             super__Vector_base<despot::MemoryPool<despot::TigerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TigerState>::Chunk_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    ppCVar2 = (this->chunks_).
              super__Vector_base<despot::MemoryPool<despot::TigerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TigerState>::Chunk_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppCVar5 != ppCVar2) {
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::TigerState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TigerState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppCVar2;
    }
  }
  ppTVar3 = (this->freelist_).
            super__Vector_base<despot::TigerState_*,_std::allocator<despot::TigerState_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->freelist_).
      super__Vector_base<despot::TigerState_*,_std::allocator<despot::TigerState_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar3) {
    (this->freelist_).
    super__Vector_base<despot::TigerState_*,_std::allocator<despot::TigerState_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar3;
  }
  this->num_allocated_ = 0;
  return;
}

Assistant:

void DeleteAll() {
		for (chunk_iterator_ i_chunk = chunks_.begin();
			i_chunk != chunks_.end(); ++i_chunk)
			delete *i_chunk;
		chunks_.clear();
		freelist_.clear();
		num_allocated_ = 0;
	}